

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

void Curl_multi_closed(Curl_easy *data,curl_socket_t s)

{
  Curl_hash *sh;
  Curl_multi *pCVar1;
  int iVar2;
  Curl_sh_entry *entry;
  
  if ((data != (Curl_easy *)0x0) && (pCVar1 = data->multi, pCVar1 != (Curl_multi *)0x0)) {
    sh = &pCVar1->sockhash;
    entry = sh_getentry(sh,s);
    if (entry != (Curl_sh_entry *)0x0) {
      if (pCVar1->socket_cb == (curl_socket_callback)0x0) {
        sh_delentry(entry,sh,s);
        return;
      }
      pCVar1->in_callback = true;
      iVar2 = (*pCVar1->socket_cb)(data,s,4,pCVar1->socket_userp,entry->socketp);
      pCVar1->in_callback = false;
      sh_delentry(entry,sh,s);
      if (iVar2 == -1) {
        pCVar1->dead = true;
      }
    }
  }
  return;
}

Assistant:

void Curl_multi_closed(struct Curl_easy *data, curl_socket_t s)
{
  if(data) {
    /* if there's still an easy handle associated with this connection */
    struct Curl_multi *multi = data->multi;
    if(multi) {
      /* this is set if this connection is part of a handle that is added to
         a multi handle, and only then this is necessary */
      struct Curl_sh_entry *entry = sh_getentry(&multi->sockhash, s);

      if(entry) {
        int rc = 0;
        if(multi->socket_cb) {
          set_in_callback(multi, TRUE);
          rc = multi->socket_cb(data, s, CURL_POLL_REMOVE,
                                multi->socket_userp, entry->socketp);
          set_in_callback(multi, FALSE);
        }

        /* now remove it from the socket hash */
        sh_delentry(entry, &multi->sockhash, s);
        if(rc == -1)
          /* This just marks the multi handle as "dead" without returning an
             error code primarily because this function is used from many
             places where propagating an error back is tricky. */
          multi->dead = TRUE;
      }
    }
  }
}